

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  int iVar1;
  string *psVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  MethodDescriptor *this_00;
  MethodDescriptorProto *proto_00;
  ServiceOptions *pSVar5;
  ServiceOptions *pSVar6;
  int local_2c;
  int i;
  ServiceDescriptorProto *proto_local;
  ServiceDescriptor *this_local;
  
  psVar2 = name_abi_cxx11_(this);
  puVar3 = internal::HasBits<1UL>::operator[](&proto->_has_bits_,0);
  *puVar3 = *puVar3 | 1;
  pAVar4 = MessageLite::GetArenaForAllocation((MessageLite *)proto);
  internal::ArenaStringPtr::Set(&proto->name_,psVar2,pAVar4);
  local_2c = 0;
  while( true ) {
    iVar1 = method_count(this);
    if (iVar1 <= local_2c) break;
    this_00 = method(this,local_2c);
    proto_00 = ServiceDescriptorProto::add_method(proto);
    MethodDescriptor::CopyTo(this_00,proto_00);
    local_2c = local_2c + 1;
  }
  pSVar5 = options(this);
  pSVar6 = ServiceOptions::default_instance();
  if (pSVar5 != pSVar6) {
    pSVar5 = ServiceDescriptorProto::mutable_options(proto);
    pSVar6 = options(this);
    ServiceOptions::CopyFrom(pSVar5,pSVar6);
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}